

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::SectionTemplateNode::WriteHeaderEntries
          (SectionTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  _List_node_base *p_Var2;
  string local_40;
  
  pcVar1 = (this->token_).text;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->token_).textlen);
  anon_unknown_14::WriteOneHeaderEntry(outstring,&local_40,filename);
  std::__cxx11::string::~string((string *)&local_40);
  p_Var2 = (_List_node_base *)&this->node_list_;
  while (p_Var2 = (((_List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->node_list_) {
    (**(code **)(*(long *)p_Var2[1]._M_next + 0x18))(p_Var2[1]._M_next,outstring,filename);
  }
  return;
}

Assistant:

void SectionTemplateNode::WriteHeaderEntries(string *outstring,
                                             const string& filename) const {
  WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                      filename);

  NodeList::const_iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    (*iter)->WriteHeaderEntries(outstring, filename);
  }
}